

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

double binomialCoefficient(double n,double k)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = 0.0;
  if ((0.0 <= k) && (k <= n)) {
    dVar2 = 1.0;
    if ((k != 0.0) || (NAN(k))) {
      if ((k != n) || (NAN(k) || NAN(n))) {
        dVar3 = n - k;
        if (k <= n - k) {
          dVar3 = k;
        }
        dVar1 = 0.0;
        dVar2 = 1.0;
        while (dVar1 < dVar3) {
          dVar4 = n - dVar1;
          dVar1 = dVar1 + 1.0;
          dVar2 = dVar2 * (dVar4 / dVar1);
        }
      }
    }
  }
  return dVar2;
}

Assistant:

double binomialCoefficient(const double n, const double k) {
    if (k < 0 || k > n) {
        return 0;
    }
    if (k == 0 || k == n) {
        return 1;
    }
    double _k = std::min(k, n - k); //# take advantage of symmetry
    double c = 1;
    for (double i = 0; i < _k; ++i) {
        c *= (n - i) / (i + 1);
    }
    return c;
}